

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

string * __thiscall
vkt::shaderexecutor::intervalToString<tcu::Vector<float,4>>
          (string *__return_storage_ptr__,shaderexecutor *this,FloatFormat *fmt,IVal *ival)

{
  long lVar1;
  IVal *pIVar2;
  byte bVar3;
  ostringstream oss;
  undefined8 uStack_200;
  undefined8 auStack_1f8 [13];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  bVar3 = 0;
  uStack_200 = 0x8b699f;
  std::__cxx11::ostringstream::ostringstream(local_190);
  lVar1 = 0x10;
  do {
    *(undefined1 *)((long)&uStack_200 + lVar1) = 0;
    *(undefined8 *)((long)auStack_1f8 + lVar1) = 0x7ff0000000000000;
    *(undefined8 *)((long)auStack_1f8 + lVar1 + 8U) = 0xfff0000000000000;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x70);
  pIVar2 = (IVal *)(auStack_1f8 + 1);
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)pIVar2->m_data = *(undefined8 *)fmt;
    fmt = (FloatFormat *)((long)fmt + (ulong)bVar3 * -0x10 + 8);
    pIVar2 = (IVal *)((long)pIVar2 + ((ulong)bVar3 * -2 + 1) * 8);
  }
  uStack_200 = 0x8b69f3;
  ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doPrintIVal
            ((FloatFormat *)this,(IVal *)(auStack_1f8 + 1),(ostream *)local_190);
  uStack_200 = 0x8b6a00;
  std::__cxx11::stringbuf::str();
  uStack_200 = 0x8b6a11;
  std::__cxx11::ostringstream::~ostringstream(local_190);
  uStack_200 = 0x8b6a1e;
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string intervalToString (const FloatFormat& fmt, const typename Traits<T>::IVal& ival)
{
	ostringstream oss;
	printIVal<T>(fmt, ival, oss);
	return oss.str();
}